

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

size_t __thiscall
axl::sl::Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::copyReverse
          (Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *this,wchar_t *p,size_t count)

{
  BufHdr *p_00;
  bool bVar1;
  EVP_PKEY_CTX *src;
  Ptr<void> shadow;
  Ptr<void> local_28;
  
  if (count == 0) {
    clear(this);
    count = 0;
  }
  else {
    shadow.m_p = (void *)0x0;
    shadow.m_refCount = (RefCount *)0x0;
    p_00 = (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr;
    if (((p_00 != (BufHdr *)0x0) && (p_00 + 1 <= p)) &&
       (p < (wchar_t *)((long)&p_00[1].super_RefCount._vptr_RefCount + p_00->m_bufferSize))) {
      rc::Ptr<void>::Ptr<axl::rc::BufHdr>(&local_28,p_00);
      rc::Ptr<void>::copy(&shadow,(EVP_PKEY_CTX *)&local_28,src);
      rc::Ptr<void>::~Ptr(&local_28);
    }
    bVar1 = setCountImpl<axl::sl::SimpleArrayDetails<wchar_t>::Construct>(this,count);
    if (bVar1) {
      ReverseArray<wchar_t>::copyReverse
                ((this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_p,p,count);
    }
    else {
      count = 0xffffffffffffffff;
    }
    rc::Ptr<void>::~Ptr(&shadow);
  }
  return count;
}

Assistant:

size_t
	copyReverse(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copyReverse(this->m_p, p, count);
		return count;
	}